

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter_test.cpp
# Opt level: O1

void __thiscall
InterpreterTestSuite_MNI_MultiEntryImportImplicitNetworkPass_Test::TestBody
          (InterpreterTestSuite_MNI_MultiEntryImportImplicitNetworkPass_Test *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *__return_storage_ptr__;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  uVar3;
  pointer pbVar4;
  element_type *this_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var5;
  _Alloc_hider _Var6;
  Registry *pRVar7;
  Status SVar8;
  bool bVar9;
  CommissionerAppMock *this_01;
  TypedExpectation<ot::commissioner::Error_(std::shared_ptr<ot::commissioner::CommissionerApp>_&,_const_ot::commissioner::Config_&)>
  *this_02;
  TypedExpectation<ot::commissioner::Error_(const_ot::commissioner::ActiveOperationalDataset_&)>
  *this_03;
  undefined8 *puVar10;
  _func_void__Any_data_ptr_shared_ptr<ot::commissioner::CommissionerApp>_ptr_Config_ptr *__tmp_1;
  long *plVar11;
  _func_bool__Any_data_ptr__Any_data_ptr__Manager_operation *__tmp;
  _func_int **pp_Var12;
  char *pcVar13;
  initializer_list<testing::Action<void_(std::shared_ptr<ot::commissioner::CommissionerApp>_&,_const_ot::commissioner::Config_&)>_>
  __l;
  Status local_549;
  AssertionResult gtest_ar_;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_538;
  _Any_data local_528;
  pointer local_518;
  code *pcStack_510;
  Expression expr;
  undefined8 uStack_4f0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_4e8;
  undefined1 auStack_4d8 [24];
  undefined1 local_4c0 [8];
  undefined **local_4b8;
  undefined1 local_4b0 [8];
  undefined1 auStack_4a8 [16];
  _Alloc_hider local_498;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_490;
  element_type local_488 [2];
  CommissionerAppMockPtr commissionerAppMock;
  Value value;
  _Any_data local_418;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_408;
  code *pcStack_400;
  ByteArray local_3f8;
  Matcher<const_ot::commissioner::Config_&> local_3d8;
  string local_3c0;
  State local_3a0;
  State local_39c;
  testing local_398;
  undefined7 uStack_397;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_390;
  string mepdsFileName;
  UnixTime local_368;
  UnixTime local_360;
  string multiEntryPendingDataset;
  Error local_338;
  Error local_310;
  BorderRouter br;
  TestContext ctx;
  
  InterpreterTestSuite::TestContext::TestContext(&ctx);
  InterpreterTestSuite::InitContext(&this->super_InterpreterTestSuite,&ctx);
  multiEntryPendingDataset._M_dataplus._M_p = (pointer)&multiEntryPendingDataset.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&multiEntryPendingDataset,
             "\n{\n  \"1122334455667788\":\n  {\n    \"DelayTimer\": 60000, // in milliseconds\n    \"PendingTimestamp\": {\n        \"Seconds\": 58, // 48 bits\n        \"Ticks\": 48, // 15 bits\n        \"U\": 0 // 1 bit\n    },\n    \"ActiveTimestamp\": {\n        \"Seconds\": 58, // 48 bits\n        \"Ticks\": 48, // 15 bits\n        \"U\": 0 // 1 bit\n    },\n    \"ExtendedPanId\": \"1122334455667788\",\n    \"NetworkName\": \"net1\",\n    \"SecurityPolicy\": {\n        \"Flags\": \"ff\",\n        \"RotationTime\": 673\n    }\n  },\n  \"99AABBCCDDEEFF00\":\n  {\n    \"DelayTimer\": 60000, // in milliseconds\n    \"PendingTimestamp\": {\n        \"Seconds\": 58, // 48 bits\n        \"Ticks\": 48, // 15 bits\n        \"U\": 0 // 1 bit\n    },\n    \"ActiveTimestamp\": {\n        \"Seconds\": 58, // 48 bits\n        \"Ticks\": 48, // 15 bits\n        \"U\": 0 // 1 bit\n    },\n    \"ExtendedPanId\": \"99AABBCCDDEEFF00\",\n    \"NetworkName\": \"net9\",\n    \"SecurityPolicy\": {\n        \"Flags\": \"ff\",\n        \"RotationTime\": 673\n    }\n  }\n}"
             ,"");
  mepdsFileName._M_dataplus._M_p = (pointer)&mepdsFileName.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&mepdsFileName,"./mepds.json","");
  ot::commissioner::WriteFile((Error *)&br,&multiEntryPendingDataset,&mepdsFileName);
  local_4c0._0_4_ = br._vptr_BorderRouter._0_4_;
  gtest_ar_._0_8_ = (ulong)(uint)gtest_ar_._4_4_ << 0x20;
  testing::internal::CmpHelperEQ<ot::commissioner::ErrorCode,ot::commissioner::ErrorCode>
            ((internal *)&value,"WriteFile(multiEntryPendingDataset, mepdsFileName).GetCode()",
             "ErrorCode::kNone",(ErrorCode *)local_4c0,(ErrorCode *)&gtest_ar_);
  if ((string *)CONCAT44(br.mNetworkId.mId,br.mId.mId) != &br.mAgent.mAddr) {
    operator_delete((undefined1 *)CONCAT44(br.mNetworkId.mId,br.mId.mId));
  }
  _Var6._M_p = value.mError.mMessage._M_dataplus._M_p;
  if ((undefined1)value.mError.mCode == kNone) {
    testing::Message::Message((Message *)&br);
    if (value.mError.mMessage._M_dataplus._M_p == (pointer)0x0) {
      pcVar13 = "";
    }
    else {
      pcVar13 = *(char **)value.mError.mMessage._M_dataplus._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_4c0,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/interpreter_test.cpp"
               ,0xbfa,pcVar13);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_4c0,(Message *)&br);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_4c0);
    if (br._vptr_BorderRouter != (_func_int **)0x0) {
      (**(code **)(*br._vptr_BorderRouter + 8))();
    }
    _Var6._M_p = value.mError.mMessage._M_dataplus._M_p;
    if (value.mError.mMessage._M_dataplus._M_p == (pointer)0x0) goto LAB_001a457a;
    commissionerAppMock.super___shared_ptr<CommissionerAppMock,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)_Var6._M_p;
    if (*value.mError.mMessage._M_dataplus._M_p != value.mError.mMessage._M_dataplus._M_p + 0x10) {
      operator_delete(*value.mError.mMessage._M_dataplus._M_p);
    }
  }
  else {
    if (value.mError.mMessage._M_dataplus._M_p != (pointer)0x0) {
      if (*value.mError.mMessage._M_dataplus._M_p != value.mError.mMessage._M_dataplus._M_p + 0x10)
      {
        operator_delete(*value.mError.mMessage._M_dataplus._M_p);
      }
      operator_delete(_Var6._M_p);
    }
    value.mError.mCode = kNone;
    value.mError._4_4_ = 0;
    testing::internal::
    CmpHelperNE<ot::commissioner::persistent_storage::Registry*,decltype(nullptr)>
              ((internal *)&br,"ctx.mRegistry","nullptr",&ctx.mRegistry,(void **)&value);
    if ((char)br._vptr_BorderRouter == '\0') {
      testing::Message::Message((Message *)&value);
      if ((undefined8 *)CONCAT44(br.mNetworkId.mId,br.mId.mId) == (undefined8 *)0x0) {
        pcVar13 = "";
      }
      else {
        pcVar13 = *(char **)CONCAT44(br.mNetworkId.mId,br.mId.mId);
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)local_4c0,kFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/interpreter_test.cpp"
                 ,0xbfc,pcVar13);
      testing::internal::AssertHelper::operator=((AssertHelper *)local_4c0,(Message *)&value);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_4c0);
      if (value.mError._0_8_ != 0) {
        (**(code **)(*(long *)value.mError._0_8_ + 8))();
      }
      p_Var2 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               CONCAT44(br.mNetworkId.mId,br.mId.mId);
      if (p_Var2 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) goto LAB_001a457a;
      commissionerAppMock.super___shared_ptr<CommissionerAppMock,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = p_Var2;
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)p_Var2->_vptr__Sp_counted_base !=
          p_Var2 + 1) {
        operator_delete((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                        p_Var2->_vptr__Sp_counted_base);
      }
    }
    else {
      puVar10 = (undefined8 *)CONCAT44(br.mNetworkId.mId,br.mId.mId);
      if (puVar10 != (undefined8 *)0x0) {
        if ((undefined8 *)*puVar10 != puVar10 + 2) {
          operator_delete((undefined8 *)*puVar10);
        }
        operator_delete(puVar10);
      }
      pRVar7 = ctx.mRegistry;
      value.mError._0_8_ = &value.mError.mMessage._M_string_length;
      std::__cxx11::string::_M_construct<char_const*>((string *)&value,"127.0.0.1","");
      local_3d8.super_MatcherBase<const_ot::commissioner::Config_&>._vptr_MatcherBase =
           (_func_int **)0x0;
      local_3d8.super_MatcherBase<const_ot::commissioner::Config_&>.impl_.
      super___shared_ptr<const_testing::MatcherInterface<const_ot::commissioner::Config_&>,_(__gnu_cxx::_Lock_policy)2>
      ._M_ptr = (MatcherInterface<const_ot::commissioner::Config_&> *)0x0;
      local_3d8.super_MatcherBase<const_ot::commissioner::Config_&>.impl_.
      super___shared_ptr<const_testing::MatcherInterface<const_ot::commissioner::Config_&>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      local_4c0 = (undefined1  [8])local_4b0;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_4c0,"1.1","");
      ot::commissioner::BorderAgent::State::State(&local_39c,0,0,0,0,0);
      gtest_ar_._0_8_ = &local_538;
      std::__cxx11::string::_M_construct<char_const*>((string *)&gtest_ar_,"net1","");
      local_4e8._M_allocated_capacity = (size_type)auStack_4d8;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_4e8,"");
      expr.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start =
           (pointer)&expr.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage;
      std::__cxx11::string::_M_construct<char_const*>((string *)&expr,"");
      local_528._M_unused._M_object = &local_518;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_528,"");
      local_3f8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_3f8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      local_3f8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_418._M_unused._M_object = &local_408;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_418,"domain1","");
      local_3c0._M_dataplus._M_p = (pointer)&local_3c0.field_2;
      pp_Var12 = (_func_int **)0x308a15;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_3c0,"","");
      ot::commissioner::UnixTime::UnixTime(&local_360,0);
      ot::commissioner::BorderAgent::BorderAgent
                ((BorderAgent *)&br,(string *)&value,0x4e21,(ByteArray *)&local_3d8,
                 (string *)local_4c0,local_39c,(string *)&gtest_ar_,0x1122334455667788,
                 (string *)&local_4e8,(string *)&expr,(Timestamp)0x0,0,(string *)&local_528,
                 &local_3f8,(string *)&local_418,'\0',0,&local_3c0,local_360,0x101f);
      local_398 = (testing)ot::commissioner::persistent_storage::Registry::Add
                                     (pRVar7,(BorderAgent *)&br);
      local_549 = kSuccess;
      testing::internal::
      CmpHelperEQ<ot::commissioner::persistent_storage::Registry::Status,ot::commissioner::persistent_storage::Registry::Status>
                ((internal *)&commissionerAppMock,
                 "ctx.mRegistry->Add(BorderAgent{\"127.0.0.1\", 20001, ByteArray{}, \"1.1\", BorderAgent::State{0, 0, 0, 0, 0}, \"net1\", 0x1122334455667788ul, \"\", \"\", Timestamp{0, 0, 0}, 0, \"\", ByteArray{}, \"domain1\", 0, 0, \"\", 0, 0x1F | BorderAgent::kDomainNameBit})"
                 ,"RegistryStatus::kSuccess",(Status *)&local_398,&local_549);
      ot::commissioner::BorderAgent::~BorderAgent((BorderAgent *)&br);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3c0._M_dataplus._M_p != &local_3c0.field_2) {
        operator_delete(local_3c0._M_dataplus._M_p);
      }
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)local_418._M_unused._0_8_ != &local_408)
      {
        operator_delete(local_418._M_unused._M_object);
      }
      if (local_3f8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_3f8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_start);
      }
      if ((pointer *)local_528._M_unused._0_8_ != &local_518) {
        operator_delete(local_528._M_unused._M_object);
      }
      if (expr.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start !=
          (pointer)&expr.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        operator_delete(expr.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start);
      }
      if ((pointer)local_4e8._M_allocated_capacity != (pointer)auStack_4d8) {
        operator_delete((void *)local_4e8._M_allocated_capacity);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)gtest_ar_._0_8_ != &local_538) {
        operator_delete((void *)gtest_ar_._0_8_);
      }
      if (local_4c0 != (undefined1  [8])local_4b0) {
        operator_delete((void *)local_4c0);
      }
      if (local_3d8.super_MatcherBase<const_ot::commissioner::Config_&>._vptr_MatcherBase !=
          (_func_int **)0x0) {
        operator_delete(local_3d8.super_MatcherBase<const_ot::commissioner::Config_&>.
                        _vptr_MatcherBase);
      }
      if ((size_type *)value.mError._0_8_ != &value.mError.mMessage._M_string_length) {
        operator_delete((void *)value.mError._0_8_);
      }
      _Var5._M_pi = commissionerAppMock.
                    super___shared_ptr<CommissionerAppMock,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                    _M_pi;
      if ((char)commissionerAppMock.
                super___shared_ptr<CommissionerAppMock,_(__gnu_cxx::_Lock_policy)2>._M_ptr == '\0')
      {
        testing::Message::Message((Message *)&br);
        if (commissionerAppMock.super___shared_ptr<CommissionerAppMock,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          pp_Var12 = (commissionerAppMock.
                      super___shared_ptr<CommissionerAppMock,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi)->_vptr__Sp_counted_base;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&value,kFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/interpreter_test.cpp"
                   ,0xc00,(char *)pp_Var12);
        testing::internal::AssertHelper::operator=((AssertHelper *)&value,(Message *)&br);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&value);
        if (br._vptr_BorderRouter != (_func_int **)0x0) {
          (**(code **)(*br._vptr_BorderRouter + 8))();
        }
        if (commissionerAppMock.super___shared_ptr<CommissionerAppMock,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)
        goto LAB_001a457a;
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
            (commissionerAppMock.super___shared_ptr<CommissionerAppMock,_(__gnu_cxx::_Lock_policy)2>
             ._M_refcount._M_pi)->_vptr__Sp_counted_base !=
            commissionerAppMock.super___shared_ptr<CommissionerAppMock,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi + 1) {
          operator_delete((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                          (commissionerAppMock.
                           super___shared_ptr<CommissionerAppMock,_(__gnu_cxx::_Lock_policy)2>.
                           _M_refcount._M_pi)->_vptr__Sp_counted_base);
        }
      }
      else {
        if (commissionerAppMock.super___shared_ptr<CommissionerAppMock,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
              (commissionerAppMock.
               super___shared_ptr<CommissionerAppMock,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
              )->_vptr__Sp_counted_base !=
              commissionerAppMock.
              super___shared_ptr<CommissionerAppMock,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
              + 1) {
            operator_delete((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                            (commissionerAppMock.
                             super___shared_ptr<CommissionerAppMock,_(__gnu_cxx::_Lock_policy)2>.
                             _M_refcount._M_pi)->_vptr__Sp_counted_base);
          }
          operator_delete(_Var5._M_pi);
        }
        pRVar7 = ctx.mRegistry;
        value.mError._0_8_ = &value.mError.mMessage._M_string_length;
        std::__cxx11::string::_M_construct<char_const*>((string *)&value,"127.0.0.2","");
        local_3d8.super_MatcherBase<const_ot::commissioner::Config_&>._vptr_MatcherBase =
             (_func_int **)0x0;
        local_3d8.super_MatcherBase<const_ot::commissioner::Config_&>.impl_.
        super___shared_ptr<const_testing::MatcherInterface<const_ot::commissioner::Config_&>,_(__gnu_cxx::_Lock_policy)2>
        ._M_ptr = (MatcherInterface<const_ot::commissioner::Config_&> *)0x0;
        local_3d8.super_MatcherBase<const_ot::commissioner::Config_&>.impl_.
        super___shared_ptr<const_testing::MatcherInterface<const_ot::commissioner::Config_&>,_(__gnu_cxx::_Lock_policy)2>
        ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        local_4c0 = (undefined1  [8])local_4b0;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_4c0,"1.1","");
        ot::commissioner::BorderAgent::State::State(&local_3a0,0,0,0,0,0);
        gtest_ar_._0_8_ = &local_538;
        std::__cxx11::string::_M_construct<char_const*>((string *)&gtest_ar_,"net2","");
        local_4e8._M_allocated_capacity = (size_type)auStack_4d8;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_4e8,"");
        expr.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start =
             (pointer)&expr.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage;
        std::__cxx11::string::_M_construct<char_const*>((string *)&expr,"");
        local_528._M_unused._M_object = &local_518;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_528,"");
        local_3f8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        local_3f8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        local_3f8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        local_418._M_unused._M_object = &local_408;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_418,"domain2","");
        local_3c0._M_dataplus._M_p = (pointer)&local_3c0.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_3c0);
        ot::commissioner::UnixTime::UnixTime(&local_368,0);
        pcVar13 = (char *)(ulong)(uint)local_3a0;
        ot::commissioner::BorderAgent::BorderAgent
                  ((BorderAgent *)&br,(string *)&value,0x4e22,(ByteArray *)&local_3d8,
                   (string *)local_4c0,local_3a0,(string *)&gtest_ar_,0x99aabbccddeeff00,
                   (string *)&local_4e8,(string *)&expr,(Timestamp)0x0,0,(string *)&local_528,
                   &local_3f8,(string *)&local_418,'\0',0,&local_3c0,local_368,0x101f);
        local_398 = (testing)ot::commissioner::persistent_storage::Registry::Add
                                       (pRVar7,(BorderAgent *)&br);
        local_549 = kSuccess;
        testing::internal::
        CmpHelperEQ<ot::commissioner::persistent_storage::Registry::Status,ot::commissioner::persistent_storage::Registry::Status>
                  ((internal *)&commissionerAppMock,
                   "ctx.mRegistry->Add(BorderAgent{\"127.0.0.2\", 20002, ByteArray{}, \"1.1\", BorderAgent::State{0, 0, 0, 0, 0}, \"net2\", 0x99AABBCCDDEEFF00ul, \"\", \"\", Timestamp{0, 0, 0}, 0, \"\", ByteArray{}, \"domain2\", 0, 0, \"\", 0, 0x1F | BorderAgent::kDomainNameBit})"
                   ,"RegistryStatus::kSuccess",(Status *)&local_398,&local_549);
        ot::commissioner::BorderAgent::~BorderAgent((BorderAgent *)&br);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_3c0._M_dataplus._M_p != &local_3c0.field_2) {
          operator_delete(local_3c0._M_dataplus._M_p);
        }
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)local_418._M_unused._0_8_ != &local_408
           ) {
          operator_delete(local_418._M_unused._M_object);
        }
        if (local_3f8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_3f8.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
        }
        if ((pointer *)local_528._M_unused._0_8_ != &local_518) {
          operator_delete(local_528._M_unused._M_object);
        }
        if (expr.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start !=
            (pointer)&expr.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
          operator_delete(expr.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
        }
        if ((pointer)local_4e8._M_allocated_capacity != (pointer)auStack_4d8) {
          operator_delete((void *)local_4e8._M_allocated_capacity);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)gtest_ar_._0_8_ != &local_538) {
          operator_delete((void *)gtest_ar_._0_8_);
        }
        if (local_4c0 != (undefined1  [8])local_4b0) {
          operator_delete((void *)local_4c0);
        }
        if (local_3d8.super_MatcherBase<const_ot::commissioner::Config_&>._vptr_MatcherBase !=
            (_func_int **)0x0) {
          operator_delete(local_3d8.super_MatcherBase<const_ot::commissioner::Config_&>.
                          _vptr_MatcherBase);
        }
        if ((size_type *)value.mError._0_8_ != &value.mError.mMessage._M_string_length) {
          operator_delete((void *)value.mError._0_8_);
        }
        _Var5._M_pi = commissionerAppMock.
                      super___shared_ptr<CommissionerAppMock,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi;
        if ((char)commissionerAppMock.
                  super___shared_ptr<CommissionerAppMock,_(__gnu_cxx::_Lock_policy)2>._M_ptr != '\0'
           ) {
          if (commissionerAppMock.
              super___shared_ptr<CommissionerAppMock,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
              != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                (commissionerAppMock.
                 super___shared_ptr<CommissionerAppMock,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                _M_pi)->_vptr__Sp_counted_base !=
                commissionerAppMock.
                super___shared_ptr<CommissionerAppMock,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                _M_pi + 1) {
              operator_delete((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                              (commissionerAppMock.
                               super___shared_ptr<CommissionerAppMock,_(__gnu_cxx::_Lock_policy)2>.
                               _M_refcount._M_pi)->_vptr__Sp_counted_base);
            }
            operator_delete(_Var5._M_pi);
          }
          ot::commissioner::persistent_storage::BorderRouter::BorderRouter(&br);
          ot::commissioner::persistent_storage::NetworkId::NetworkId((NetworkId *)&value,0);
          br.mNetworkId.mId = value.mError.mCode;
          SVar8 = ot::commissioner::persistent_storage::Registry::SetCurrentNetwork
                            (ctx.mRegistry,&br);
          local_4c0[0] = SVar8;
          gtest_ar_._0_8_ = gtest_ar_._0_8_ & 0xffffffffffffff00;
          testing::internal::
          CmpHelperEQ<ot::commissioner::persistent_storage::Registry::Status,ot::commissioner::persistent_storage::Registry::Status>
                    ((internal *)&value,"ctx.mRegistry->SetCurrentNetwork(br)",
                     "RegistryStatus::kSuccess",local_4c0,&gtest_ar_.success_);
          _Var6 = value.mError.mMessage._M_dataplus;
          if ((undefined1)value.mError.mCode == kNone) {
            testing::Message::Message((Message *)local_4c0);
            if (value.mError.mMessage._M_dataplus._M_p == (pointer)0x0) {
              pcVar13 = "";
            }
            else {
              pcVar13 = *(char **)value.mError.mMessage._M_dataplus._M_p;
            }
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&gtest_ar_,kFatalFailure,
                       "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/interpreter_test.cpp"
                       ,0xc07,pcVar13);
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)&gtest_ar_,(Message *)local_4c0);
            testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_);
            if (local_4c0 != (undefined1  [8])0x0) {
              (**(code **)(*(long *)local_4c0 + 8))();
            }
            _Var6._M_p = value.mError.mMessage._M_dataplus._M_p;
            if (value.mError.mMessage._M_dataplus._M_p != (pointer)0x0) {
              if (*value.mError.mMessage._M_dataplus._M_p !=
                  value.mError.mMessage._M_dataplus._M_p + 0x10) {
                operator_delete(*value.mError.mMessage._M_dataplus._M_p);
              }
              operator_delete(_Var6._M_p);
            }
          }
          else {
            if (value.mError.mMessage._M_dataplus._M_p != (pointer)0x0) {
              if (*value.mError.mMessage._M_dataplus._M_p !=
                  value.mError.mMessage._M_dataplus._M_p + 0x10) {
                operator_delete(*value.mError.mMessage._M_dataplus._M_p);
              }
              operator_delete(_Var6._M_p);
            }
            this_01 = (CommissionerAppMock *)operator_new(0x1838);
            memset(this_01,0,0x1838);
            CommissionerAppMock::CommissionerAppMock(this_01);
            commissionerAppMock.super___shared_ptr<CommissionerAppMock,_(__gnu_cxx::_Lock_policy)2>.
            _M_ptr = this_01;
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<CommissionerAppMock*>
                      (&commissionerAppMock.
                        super___shared_ptr<CommissionerAppMock,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount,this_01);
            local_3c0._M_string_length = (size_type)operator_new(8);
            (((MatcherInterface<std::shared_ptr<ot::commissioner::CommissionerApp>_&> *)
             local_3c0._M_string_length)->super_MatcherDescriberInterface).
            _vptr_MatcherDescriberInterface = (_func_int **)&PTR__MatcherDescriberInterface_003a48d0
            ;
            local_3c0._M_dataplus._M_p = (pointer)&PTR__MatcherBase_0039fc90;
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
            __shared_count<testing::MatcherInterface<std::shared_ptr<ot::commissioner::CommissionerApp>&>const*>
                      ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                       &local_3c0.field_2._M_allocated_capacity,
                       (MatcherInterface<std::shared_ptr<ot::commissioner::CommissionerApp>_&> *)
                       local_3c0._M_string_length);
            local_3c0._M_dataplus._M_p = (pointer)&PTR__MatcherBase_0039fc48;
            local_3d8.super_MatcherBase<const_ot::commissioner::Config_&>.impl_.
            super___shared_ptr<const_testing::MatcherInterface<const_ot::commissioner::Config_&>,_(__gnu_cxx::_Lock_policy)2>
            ._M_ptr = (element_type *)operator_new(8);
            ((local_3d8.super_MatcherBase<const_ot::commissioner::Config_&>.impl_.
              super___shared_ptr<const_testing::MatcherInterface<const_ot::commissioner::Config_&>,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr)->super_MatcherDescriberInterface)._vptr_MatcherDescriberInterface =
                 (_func_int **)&PTR__MatcherDescriberInterface_003a4988;
            local_3d8.super_MatcherBase<const_ot::commissioner::Config_&>._vptr_MatcherBase =
                 (_func_int **)&PTR__MatcherBase_0039fcf8;
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
            __shared_count<testing::MatcherInterface<ot::commissioner::Config_const&>const*>
                      (&local_3d8.super_MatcherBase<const_ot::commissioner::Config_&>.impl_.
                        super___shared_ptr<const_testing::MatcherInterface<const_ot::commissioner::Config_&>,_(__gnu_cxx::_Lock_policy)2>
                        ._M_refcount,
                       local_3d8.super_MatcherBase<const_ot::commissioner::Config_&>.impl_.
                       super___shared_ptr<const_testing::MatcherInterface<const_ot::commissioner::Config_&>,_(__gnu_cxx::_Lock_policy)2>
                       ._M_ptr);
            local_3d8.super_MatcherBase<const_ot::commissioner::Config_&>._vptr_MatcherBase =
                 (_func_int **)&PTR__MatcherBase_0039fcb0;
            CommissionerAppStaticExpecter::gmock_Create
                      ((MockSpec<ot::commissioner::Error_(std::shared_ptr<ot::commissioner::CommissionerApp>_&,_const_ot::commissioner::Config_&)>
                        *)local_4c0,&ctx.mCommissionerAppStaticExpecter,
                       (Matcher<std::shared_ptr<ot::commissioner::CommissionerApp>_&> *)&local_3c0,
                       &local_3d8);
            testing::internal::GetWithoutMatchers();
            this_02 = testing::internal::
                      MockSpec<ot::commissioner::Error_(std::shared_ptr<ot::commissioner::CommissionerApp>_&,_const_ot::commissioner::Config_&)>
                      ::InternalExpectedAt
                                ((MockSpec<ot::commissioner::Error_(std::shared_ptr<ot::commissioner::CommissionerApp>_&,_const_ot::commissioner::Config_&)>
                                  *)local_4c0,
                                 "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/interpreter_test.cpp"
                                 ,0xc0a,"ctx.mCommissionerAppStaticExpecter","Create(_, _)");
            paVar1 = &local_310.mMessage.field_2;
            local_310.mCode = kNone;
            local_310.mMessage._M_string_length = 0;
            local_310.mMessage.field_2._M_local_buf[0] = '\0';
            local_310.mMessage._M_dataplus._M_p = (pointer)paVar1;
            testing::Return<ot::commissioner::Error>(&local_398,&local_310);
            local_3f8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_start = (pointer)CONCAT71(uStack_397,local_398);
            local_3f8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_finish = (pointer)local_390;
            if (local_390 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              if (__libc_single_threaded == '\0') {
                LOCK();
                local_390->_M_use_count = local_390->_M_use_count + 1;
                UNLOCK();
              }
              else {
                local_390->_M_use_count = local_390->_M_use_count + 1;
              }
            }
            local_4e8._8_8_ = (pointer)0x0;
            auStack_4d8._0_8_ =
                 std::
                 _Function_handler<void_(std::shared_ptr<ot::commissioner::CommissionerApp>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/interpreter_test.cpp:3084:30)>
                 ::_M_manager;
            auStack_4d8._8_8_ =
                 std::
                 _Function_handler<void_(std::shared_ptr<ot::commissioner::CommissionerApp>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/interpreter_test.cpp:3084:30)>
                 ::_M_invoke;
            local_4e8._M_allocated_capacity = (size_type)(pointer)&commissionerAppMock;
            local_3f8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage = (pointer)&commissionerAppMock;
            std::function<void_(std::shared_ptr<ot::commissioner::CommissionerApp>_&)>::function
                      ((function<void_(std::shared_ptr<ot::commissioner::CommissionerApp>_&)> *)
                       &expr,(function<void_(std::shared_ptr<ot::commissioner::CommissionerApp>_&)>
                              *)&local_4e8);
            local_518 = (pointer)0x0;
            pcStack_510 = (code *)0x0;
            local_528._M_unused._M_object = (void *)0x0;
            local_528._8_8_ = 0;
            local_538._M_allocated_capacity = 0;
            local_538._8_8_ = 0;
            gtest_ar_.success_ = false;
            gtest_ar_._1_7_ = 0;
            gtest_ar_.message_._M_t.
            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl =
                 (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                  )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )0x0;
            local_528._M_unused._M_object = operator_new(0x20);
            pbVar4 = local_518;
            (((pointer)local_528._M_unused._0_8_)->_M_dataplus)._M_p = (pointer)0x0;
            ((pointer)local_528._M_unused._0_8_)->_M_string_length = 0;
            (((pointer)local_528._M_unused._0_8_)->field_2)._M_allocated_capacity = 0;
            *(undefined8 *)((long)&((pointer)local_528._M_unused._0_8_)->field_2 + 8) = uStack_4f0;
            if (expr.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage != (pointer)0x0) {
              (((pointer)local_528._M_unused._0_8_)->_M_dataplus)._M_p =
                   (pointer)expr.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start;
              ((pointer)local_528._M_unused._0_8_)->_M_string_length =
                   (size_type)
                   expr.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
              (((pointer)local_528._M_unused._0_8_)->field_2)._M_allocated_capacity =
                   (size_type)
                   expr.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage;
              expr.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            }
            local_528._8_8_ =
                 gtest_ar_.message_._M_t.
                 super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 .
                 super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                 ._M_head_impl;
            gtest_ar_.success_ = false;
            gtest_ar_._1_7_ = 0;
            gtest_ar_.message_._M_t.
            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl =
                 (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                  )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )0x0;
            local_538._M_allocated_capacity = (size_type)local_518;
            local_518 = (pointer)std::_Function_handler::operator_cast_to_Action;
            local_538._8_8_ = pcStack_510;
            pcStack_510 = std::_Function_handler::operator_cast_to_Action;
            if (pbVar4 != (pointer)0x0) {
              (*(code *)pbVar4)(&gtest_ar_,&gtest_ar_,3);
            }
            if (expr.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage != (pointer)0x0) {
              (*(code *)expr.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage)(&expr,&expr,3);
            }
            if ((pointer)auStack_4d8._0_8_ != (pointer)0x0) {
              (*(code *)auStack_4d8._0_8_)(&local_4e8,&local_4e8,3);
            }
            __l._M_len = 1;
            __l._M_array = (iterator)&local_528;
            std::
            vector<testing::Action<void_(std::shared_ptr<ot::commissioner::CommissionerApp>_&,_const_ot::commissioner::Config_&)>,_std::allocator<testing::Action<void_(std::shared_ptr<ot::commissioner::CommissionerApp>_&,_const_ot::commissioner::Config_&)>_>_>
            ::vector((vector<testing::Action<void_(std::shared_ptr<ot::commissioner::CommissionerApp>_&,_const_ot::commissioner::Config_&)>,_std::allocator<testing::Action<void_(std::shared_ptr<ot::commissioner::CommissionerApp>_&,_const_ot::commissioner::Config_&)>_>_>
                      *)&value,__l,(allocator_type *)&gtest_ar_);
            if (local_518 != (pointer)0x0) {
              (*(code *)local_518)(&local_528,&local_528,3);
            }
            __return_storage_ptr__ = &value.mError.mMessage.field_2;
            testing::internal::ReturnAction::operator_cast_to_Action
                      ((Action<ot::commissioner::Error_(std::shared_ptr<ot::commissioner::CommissionerApp>_&,_const_ot::commissioner::Config_&)>
                        *)__return_storage_ptr__,(ReturnAction *)&local_3f8);
            local_408 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
            pcStack_400 = (code *)0x0;
            local_418._M_unused._M_object = (void *)0x0;
            local_418._8_8_ = 0;
            local_538._M_allocated_capacity = 0;
            local_538._8_8_ = 0;
            gtest_ar_.success_ = false;
            gtest_ar_._1_7_ = 0;
            gtest_ar_.message_._M_t.
            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl =
                 (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                  )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )0x0;
            local_418._M_unused._M_object = operator_new(0x38);
            p_Var2 = local_408;
            *(undefined8 *)local_418._M_unused._0_8_ = value.mError._0_8_;
            *(pointer *)((long)local_418._M_unused._0_8_ + 8) =
                 value.mError.mMessage._M_dataplus._M_p;
            *(size_type *)((long)local_418._M_unused._0_8_ + 0x10) =
                 value.mError.mMessage._M_string_length;
            value.mError.mMessage._M_string_length = 0;
            value.mError.mCode = kNone;
            value.mError._4_4_ = 0;
            value.mError.mMessage._M_dataplus._M_p = (pointer)0x0;
            *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
             ((long)local_418._M_unused._0_8_ + 0x28) =
                 (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
            *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
             ((long)local_418._M_unused._0_8_ + 0x18) =
                 (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
            *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
             ((long)local_418._M_unused._0_8_ + 0x20) =
                 (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
            *(size_type *)((long)local_418._M_unused._0_8_ + 0x30) = value.mData._M_string_length;
            if (value.mData._M_dataplus._M_p != (pointer)0x0) {
              *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
               ((long)local_418._M_unused._0_8_ + 0x18) =
                   (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                   CONCAT71(value.mError.mMessage.field_2._M_allocated_capacity._1_7_,
                            value.mError.mMessage.field_2._M_local_buf[0]);
              *(undefined8 *)((long)local_418._M_unused._0_8_ + 0x20) =
                   value.mError.mMessage.field_2._8_8_;
              *(pointer *)((long)local_418._M_unused._0_8_ + 0x28) = value.mData._M_dataplus._M_p;
              value.mData._M_dataplus._M_p = (pointer)0x0;
              value.mData._M_string_length = 0;
            }
            local_418._8_8_ =
                 gtest_ar_.message_._M_t.
                 super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 .
                 super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                 ._M_head_impl;
            gtest_ar_.success_ = false;
            gtest_ar_._1_7_ = 0;
            gtest_ar_.message_._M_t.
            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl =
                 (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                  )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )0x0;
            local_538._M_allocated_capacity = (size_type)local_408;
            local_408 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                        std::_Function_handler::operator_cast_to_Action;
            local_538._8_8_ = pcStack_400;
            pcStack_400 = std::_Function_handler::operator_cast_to_Action;
            if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              (*(code *)p_Var2)(&gtest_ar_,&gtest_ar_,3);
            }
            if (value.mData._M_dataplus._M_p != (pointer)0x0) {
              (*(code *)value.mData._M_dataplus._M_p)
                        (__return_storage_ptr__,__return_storage_ptr__,3);
            }
            std::
            vector<testing::Action<void_(std::shared_ptr<ot::commissioner::CommissionerApp>_&,_const_ot::commissioner::Config_&)>,_std::allocator<testing::Action<void_(std::shared_ptr<ot::commissioner::CommissionerApp>_&,_const_ot::commissioner::Config_&)>_>_>
            ::~vector((vector<testing::Action<void_(std::shared_ptr<ot::commissioner::CommissionerApp>_&,_const_ot::commissioner::Config_&)>,_std::allocator<testing::Action<void_(std::shared_ptr<ot::commissioner::CommissionerApp>_&,_const_ot::commissioner::Config_&)>_>_>
                       *)&value);
            testing::internal::
            TypedExpectation<ot::commissioner::Error_(std::shared_ptr<ot::commissioner::CommissionerApp>_&,_const_ot::commissioner::Config_&)>
            ::WillOnce(this_02,(Action<ot::commissioner::Error_(std::shared_ptr<ot::commissioner::CommissionerApp>_&,_const_ot::commissioner::Config_&)>
                                *)&local_418);
            if (local_408 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              (*(code *)local_408)(&local_418,&local_418,3);
            }
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                local_3f8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_finish !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                         local_3f8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                         ._M_impl.super__Vector_impl_data._M_finish);
            }
            if (local_390 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_390);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_310.mMessage._M_dataplus._M_p != paVar1) {
              operator_delete(local_310.mMessage._M_dataplus._M_p);
            }
            auStack_4a8._8_8_ = &PTR__MatcherBase_0039fc90;
            if (local_490._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_490._M_pi);
            }
            local_4b8 = &PTR__MatcherBase_0039fcf8;
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)auStack_4a8._0_8_ !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)auStack_4a8._0_8_);
            }
            local_3d8.super_MatcherBase<const_ot::commissioner::Config_&>._vptr_MatcherBase =
                 (_func_int **)&PTR__MatcherBase_0039fcf8;
            if (local_3d8.super_MatcherBase<const_ot::commissioner::Config_&>.impl_.
                super___shared_ptr<const_testing::MatcherInterface<const_ot::commissioner::Config_&>,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        (local_3d8.super_MatcherBase<const_ot::commissioner::Config_&>.impl_.
                         super___shared_ptr<const_testing::MatcherInterface<const_ot::commissioner::Config_&>,_(__gnu_cxx::_Lock_policy)2>
                         ._M_refcount._M_pi);
            }
            local_3c0._M_dataplus._M_p = (pointer)&PTR__MatcherBase_0039fc90;
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                local_3c0.field_2._M_allocated_capacity !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                         local_3c0.field_2._M_allocated_capacity);
            }
            this_00 = commissionerAppMock.
                      super___shared_ptr<CommissionerAppMock,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
            gtest_ar_.message_._M_t.
            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl =
                 (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                  )operator_new(8);
            *(undefined ***)
             gtest_ar_.message_._M_t.
             super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             .
             super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
             ._M_head_impl = &PTR__MatcherDescriberInterface_003a4f18;
            gtest_ar_._0_8_ = &PTR__MatcherBase_003a22f8;
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
            __shared_count<testing::MatcherInterface<ot::commissioner::ActiveOperationalDataset_const&>const*>
                      ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                       &local_538._M_allocated_capacity,
                       (MatcherInterface<const_ot::commissioner::ActiveOperationalDataset_&> *)
                       gtest_ar_.message_._M_t.
                       super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       .
                       super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                       ._M_head_impl);
            gtest_ar_._0_8_ = &PTR__MatcherBase_003a22b0;
            CommissionerAppMock::gmock_SetActiveDataset
                      ((MockSpec<ot::commissioner::Error_(const_ot::commissioner::ActiveOperationalDataset_&)>
                        *)&value,this_00,
                       (Matcher<const_ot::commissioner::ActiveOperationalDataset_&> *)&gtest_ar_);
            testing::internal::GetWithoutMatchers();
            this_03 = testing::internal::
                      MockSpec<ot::commissioner::Error_(const_ot::commissioner::ActiveOperationalDataset_&)>
                      ::InternalExpectedAt
                                ((MockSpec<ot::commissioner::Error_(const_ot::commissioner::ActiveOperationalDataset_&)>
                                  *)&value,
                                 "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/interpreter_test.cpp"
                                 ,0xc0d,"*commissionerAppMock","SetActiveDataset(_)");
            paVar1 = &local_338.mMessage.field_2;
            local_338.mCode = kNone;
            local_338.mMessage._M_string_length = 0;
            local_338.mMessage.field_2._M_local_buf[0] = '\0';
            local_338.mMessage._M_dataplus._M_p = (pointer)paVar1;
            testing::Return<ot::commissioner::Error>((testing *)local_4e8._M_local_buf,&local_338);
            testing::internal::ReturnAction::operator_cast_to_Action
                      ((Action<ot::commissioner::Error_(const_ot::commissioner::ActiveOperationalDataset_&)>
                        *)local_4c0,(ReturnAction *)local_4e8._M_local_buf);
            testing::internal::
            TypedExpectation<ot::commissioner::Error_(const_ot::commissioner::ActiveOperationalDataset_&)>
            ::WillOnce(this_03,(Action<ot::commissioner::Error_(const_ot::commissioner::ActiveOperationalDataset_&)>
                                *)local_4c0);
            if (local_4b0 != (undefined1  [8])0x0) {
              (*(code *)local_4b0)(local_4c0,local_4c0,3);
            }
            if ((pointer)local_4e8._8_8_ != (pointer)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_4e8._8_8_);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_338.mMessage._M_dataplus._M_p != paVar1) {
              operator_delete(local_338.mMessage._M_dataplus._M_p);
            }
            value.mError.mMessage._M_dataplus._M_p = (pointer)&PTR__MatcherBase_003a22f8;
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                CONCAT71(value.mError.mMessage.field_2._M_allocated_capacity._1_7_,
                         value.mError.mMessage.field_2._M_local_buf[0]) !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                         CONCAT71(value.mError.mMessage.field_2._M_allocated_capacity._1_7_,
                                  value.mError.mMessage.field_2._M_local_buf[0]));
            }
            gtest_ar_._0_8_ = &PTR__MatcherBase_003a22f8;
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_538._M_allocated_capacity !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                         local_538._M_allocated_capacity);
            }
            expr.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            expr.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
            expr.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
            paVar1 = &value.mData.field_2;
            value.mError._0_8_ = value.mError._0_8_ & 0xffffffff00000000;
            value.mError.mMessage._M_string_length = 0;
            value.mError.mMessage.field_2._M_local_buf[0] = '\0';
            value.mData._M_string_length = 0;
            value.mData.field_2._M_local_buf[0] = '\0';
            local_4c0 = (undefined1  [8])local_4b0;
            value.mError.mMessage._M_dataplus._M_p = (pointer)__return_storage_ptr__;
            value.mData._M_dataplus._M_p = (pointer)paVar1;
            std::__cxx11::string::_M_construct<char_const*>((string *)local_4c0,"start","");
            ot::commissioner::Interpreter::ParseExpression
                      ((Expression *)&local_4e8,&ctx.mInterpreter,(string *)local_4c0);
            local_538._M_allocated_capacity =
                 (size_type)
                 expr.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage;
            gtest_ar_.message_._M_t.
            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl =
                 (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                  )(__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                    )expr.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
            gtest_ar_._0_8_ =
                 expr.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
            expr.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start = (pointer)local_4e8._M_allocated_capacity;
            expr.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish = (pointer)local_4e8._8_8_;
            expr.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)auStack_4d8._0_8_;
            local_4e8._M_allocated_capacity = 0;
            local_4e8._8_8_ = 0;
            auStack_4d8._0_8_ = (pointer)0x0;
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&gtest_ar_);
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&local_4e8);
            if (local_4c0 != (undefined1  [8])local_4b0) {
              operator_delete((void *)local_4c0);
            }
            ot::commissioner::Interpreter::Eval((Value *)local_4c0,&ctx.mInterpreter,&expr);
            bVar9 = ot::commissioner::Interpreter::Value::HasNoError((Value *)local_4c0);
            gtest_ar_.success_ = bVar9;
            gtest_ar_.message_._M_t.
            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl =
                 (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                  )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )0x0;
            if ((element_type *)local_498._M_p != local_488) {
              operator_delete(local_498._M_p);
            }
            if (local_4b8 != (undefined **)auStack_4a8) {
              operator_delete(local_4b8);
            }
            if (gtest_ar_.success_ == false) {
              testing::Message::Message((Message *)&local_4e8._M_allocated_capacity);
              testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                        ((string *)local_4c0,(internal *)&gtest_ar_,
                         (AssertionResult *)"ctx.mInterpreter.Eval(expr).HasNoError()","false",
                         "true",pcVar13);
              testing::internal::AssertHelper::AssertHelper
                        ((AssertHelper *)&local_528,kNonFatalFailure,
                         "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/interpreter_test.cpp"
                         ,0xc12,(char *)local_4c0);
              testing::internal::AssertHelper::operator=
                        ((AssertHelper *)&local_528,(Message *)&local_4e8._M_allocated_capacity);
              testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_528);
              if (local_4c0 != (undefined1  [8])local_4b0) {
                operator_delete((void *)local_4c0);
              }
              if ((long *)local_4e8._M_allocated_capacity != (long *)0x0) {
                (**(code **)(*(long *)local_4e8._M_allocated_capacity + 8))();
              }
            }
            uVar3._M_t.
            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl =
                 gtest_ar_.message_._M_t.
                 super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 .
                 super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                 ._M_head_impl;
            if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )gtest_ar_.message_._M_t.
                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  .
                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                  ._M_head_impl !=
                (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )0x0) {
              if (*(void **)gtest_ar_.message_._M_t.
                            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            .
                            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                            ._M_head_impl !=
                  (void *)((long)gtest_ar_.message_._M_t.
                                 super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 .
                                 super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                 ._M_head_impl + 0x10)) {
                operator_delete(*(void **)gtest_ar_.message_._M_t.
                                          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                          ._M_t.
                                          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                          .
                                          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                          ._M_head_impl);
              }
              operator_delete((void *)uVar3._M_t.
                                      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      ._M_t.
                                      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      .
                                      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                      ._M_head_impl);
            }
            ot::commissioner::Interpreter::MultiNetCommandContext::Cleanup
                      ((MultiNetCommandContext *)&ctx);
            ot::commissioner::JobManager::CleanupJobs
                      (ctx.mInterpreter.mJobManager.
                       super___shared_ptr<ot::commissioner::JobManager,_(__gnu_cxx::_Lock_policy)2>.
                       _M_ptr);
            gtest_ar_._0_8_ = &local_538;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&gtest_ar_,"opdataset set active --import ","");
            puVar10 = (undefined8 *)
                      std::__cxx11::string::_M_append
                                (&gtest_ar_.success_,(ulong)mepdsFileName._M_dataplus._M_p);
            local_4c0 = (undefined1  [8])local_4b0;
            plVar11 = puVar10 + 2;
            if ((long *)*puVar10 == plVar11) {
              local_4b0 = (undefined1  [8])*plVar11;
              auStack_4a8._0_8_ = puVar10[3];
            }
            else {
              local_4b0 = (undefined1  [8])*plVar11;
              local_4c0 = (undefined1  [8])*puVar10;
            }
            local_4b8 = (undefined **)puVar10[1];
            *puVar10 = plVar11;
            puVar10[1] = 0;
            *(undefined1 *)(puVar10 + 2) = 0;
            ot::commissioner::Interpreter::ParseExpression
                      ((Expression *)&local_528,&ctx.mInterpreter,(string *)local_4c0);
            auStack_4d8._0_8_ =
                 expr.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage;
            local_4e8._8_8_ =
                 expr.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
            local_4e8._M_allocated_capacity =
                 (size_type)
                 expr.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
            expr.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start = (pointer)local_528._M_unused._0_8_;
            expr.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish = (pointer)local_528._8_8_;
            expr.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage = local_518;
            local_528._M_unused._M_object = (pointer *)0x0;
            local_528._8_8_ = 0;
            local_518 = (pointer)0x0;
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&local_4e8);
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&local_528);
            if (local_4c0 != (undefined1  [8])local_4b0) {
              operator_delete((void *)local_4c0);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)gtest_ar_._0_8_ != &local_538) {
              operator_delete((void *)gtest_ar_._0_8_);
            }
            ot::commissioner::Interpreter::Eval((Value *)local_4c0,&ctx.mInterpreter,&expr);
            value.mError.mCode = local_4c0._0_4_;
            std::__cxx11::string::operator=((string *)&value.mError.mMessage,(string *)&local_4b8);
            std::__cxx11::string::operator=((string *)&value.mData,(string *)&local_498);
            if ((element_type *)local_498._M_p != local_488) {
              operator_delete(local_498._M_p);
            }
            if (local_4b8 != (undefined **)auStack_4a8) {
              operator_delete(local_4b8);
            }
            bVar9 = ot::commissioner::Interpreter::Value::HasNoError(&value);
            gtest_ar_.success_ = bVar9;
            gtest_ar_.message_._M_t.
            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl =
                 (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                  )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )0x0;
            if (!bVar9) {
              testing::Message::Message((Message *)&local_4e8._M_allocated_capacity);
              testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                        ((string *)local_4c0,(internal *)&gtest_ar_,(AssertionResult *)0x2e6ffe,
                         "false","true",pcVar13);
              testing::internal::AssertHelper::AssertHelper
                        ((AssertHelper *)&local_528,kNonFatalFailure,
                         "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/interpreter_test.cpp"
                         ,0xc18,(char *)local_4c0);
              testing::internal::AssertHelper::operator=
                        ((AssertHelper *)&local_528,(Message *)&local_4e8._M_allocated_capacity);
              testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_528);
              if (local_4c0 != (undefined1  [8])local_4b0) {
                operator_delete((void *)local_4c0);
              }
              if ((pointer)local_4e8._M_allocated_capacity != (pointer)0x0) {
                (**(code **)(*(long *)local_4e8._M_allocated_capacity + 8))();
              }
            }
            uVar3._M_t.
            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl =
                 gtest_ar_.message_._M_t.
                 super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 .
                 super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                 ._M_head_impl;
            if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )gtest_ar_.message_._M_t.
                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  .
                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                  ._M_head_impl !=
                (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )0x0) {
              if (*(void **)gtest_ar_.message_._M_t.
                            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            .
                            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                            ._M_head_impl !=
                  (void *)((long)gtest_ar_.message_._M_t.
                                 super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 .
                                 super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                 ._M_head_impl + 0x10)) {
                operator_delete(*(void **)gtest_ar_.message_._M_t.
                                          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                          ._M_t.
                                          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                          .
                                          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                          ._M_head_impl);
              }
              operator_delete((void *)uVar3._M_t.
                                      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      ._M_t.
                                      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      .
                                      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                      ._M_head_impl);
            }
            unlink(mepdsFileName._M_dataplus._M_p);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)value.mData._M_dataplus._M_p != paVar1) {
              operator_delete(value.mData._M_dataplus._M_p);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)value.mError.mMessage._M_dataplus._M_p != __return_storage_ptr__) {
              operator_delete(value.mError.mMessage._M_dataplus._M_p);
            }
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector(&expr);
            if (commissionerAppMock.
                super___shared_ptr<CommissionerAppMock,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        (commissionerAppMock.
                         super___shared_ptr<CommissionerAppMock,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi);
            }
          }
          br._vptr_BorderRouter = (_func_int **)&PTR__BorderRouter_0039ff00;
          ot::commissioner::BorderAgent::~BorderAgent(&br.mAgent);
          goto LAB_001a457a;
        }
        testing::Message::Message((Message *)&br);
        pp_Var12 = (_func_int **)0x308a15;
        if (commissionerAppMock.super___shared_ptr<CommissionerAppMock,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          pp_Var12 = (commissionerAppMock.
                      super___shared_ptr<CommissionerAppMock,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi)->_vptr__Sp_counted_base;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&value,kFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/interpreter_test.cpp"
                   ,0xc04,(char *)pp_Var12);
        testing::internal::AssertHelper::operator=((AssertHelper *)&value,(Message *)&br);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&value);
        if (br._vptr_BorderRouter != (_func_int **)0x0) {
          (**(code **)(*br._vptr_BorderRouter + 8))();
        }
        if (commissionerAppMock.super___shared_ptr<CommissionerAppMock,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)
        goto LAB_001a457a;
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
            (commissionerAppMock.super___shared_ptr<CommissionerAppMock,_(__gnu_cxx::_Lock_policy)2>
             ._M_refcount._M_pi)->_vptr__Sp_counted_base !=
            commissionerAppMock.super___shared_ptr<CommissionerAppMock,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi + 1) {
          operator_delete((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                          (commissionerAppMock.
                           super___shared_ptr<CommissionerAppMock,_(__gnu_cxx::_Lock_policy)2>.
                           _M_refcount._M_pi)->_vptr__Sp_counted_base);
        }
      }
    }
  }
  operator_delete(commissionerAppMock.
                  super___shared_ptr<CommissionerAppMock,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                  _M_pi);
LAB_001a457a:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)mepdsFileName._M_dataplus._M_p != &mepdsFileName.field_2) {
    operator_delete(mepdsFileName._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)multiEntryPendingDataset._M_dataplus._M_p != &multiEntryPendingDataset.field_2) {
    operator_delete(multiEntryPendingDataset._M_dataplus._M_p);
  }
  InterpreterTestSuite::TestContext::~TestContext(&ctx);
  return;
}

Assistant:

TEST_F(InterpreterTestSuite, MNI_MultiEntryImportImplicitNetworkPass)
{
    TestContext ctx;
    InitContext(ctx);

    const std::string multiEntryPendingDataset = "\n\
{\n\
  \"1122334455667788\":\n\
  {\n\
    \"DelayTimer\": 60000, // in milliseconds\n\
    \"PendingTimestamp\": {\n\
        \"Seconds\": 58, // 48 bits\n\
        \"Ticks\": 48, // 15 bits\n\
        \"U\": 0 // 1 bit\n\
    },\n\
    \"ActiveTimestamp\": {\n\
        \"Seconds\": 58, // 48 bits\n\
        \"Ticks\": 48, // 15 bits\n\
        \"U\": 0 // 1 bit\n\
    },\n\
    \"ExtendedPanId\": \"1122334455667788\",\n\
    \"NetworkName\": \"net1\",\n\
    \"SecurityPolicy\": {\n\
        \"Flags\": \"ff\",\n\
        \"RotationTime\": 673\n\
    }\n\
  },\n\
  \"99AABBCCDDEEFF00\":\n\
  {\n\
    \"DelayTimer\": 60000, // in milliseconds\n\
    \"PendingTimestamp\": {\n\
        \"Seconds\": 58, // 48 bits\n\
        \"Ticks\": 48, // 15 bits\n\
        \"U\": 0 // 1 bit\n\
    },\n\
    \"ActiveTimestamp\": {\n\
        \"Seconds\": 58, // 48 bits\n\
        \"Ticks\": 48, // 15 bits\n\
        \"U\": 0 // 1 bit\n\
    },\n\
    \"ExtendedPanId\": \"99AABBCCDDEEFF00\",\n\
    \"NetworkName\": \"net9\",\n\
    \"SecurityPolicy\": {\n\
        \"Flags\": \"ff\",\n\
        \"RotationTime\": 673\n\
    }\n\
  }\n\
}";
    const std::string mepdsFileName            = "./mepds.json";
    ASSERT_EQ(WriteFile(multiEntryPendingDataset, mepdsFileName).GetCode(), ErrorCode::kNone);

    ASSERT_NE(ctx.mRegistry, nullptr);
    ASSERT_EQ(ctx.mRegistry->Add(BorderAgent{"127.0.0.1", 20001, ByteArray{}, "1.1", BorderAgent::State{0, 0, 0, 0, 0},
                                             "net1", 0x1122334455667788ul, "", "", Timestamp{0, 0, 0}, 0, "",
                                             ByteArray{}, "domain1", 0, 0, "", 0, 0x1F | BorderAgent::kDomainNameBit}),
              RegistryStatus::kSuccess);
    ASSERT_EQ(ctx.mRegistry->Add(BorderAgent{"127.0.0.2", 20002, ByteArray{}, "1.1", BorderAgent::State{0, 0, 0, 0, 0},
                                             "net2", 0x99AABBCCDDEEFF00ul, "", "", Timestamp{0, 0, 0}, 0, "",
                                             ByteArray{}, "domain2", 0, 0, "", 0, 0x1F | BorderAgent::kDomainNameBit}),
              RegistryStatus::kSuccess);
    BorderRouter br;
    br.mNetworkId = 0;
    ASSERT_EQ(ctx.mRegistry->SetCurrentNetwork(br), RegistryStatus::kSuccess);

    CommissionerAppMockPtr commissionerAppMock{new CommissionerAppMock()};
    EXPECT_CALL(ctx.mCommissionerAppStaticExpecter, Create(_, _))
        .WillOnce(
            DoAll(WithArg<0>([&](std::shared_ptr<CommissionerApp> &a) { a = commissionerAppMock; }), Return(Error{})));
    EXPECT_CALL(*commissionerAppMock, SetActiveDataset(_)).WillOnce(Return(Error{}));
    Interpreter::Expression expr;
    Interpreter::Value      value;

    expr = ctx.mInterpreter.ParseExpression("start");
    EXPECT_TRUE(ctx.mInterpreter.Eval(expr).HasNoError());
    ctx.mInterpreter.mContext.Cleanup();
    ctx.mInterpreter.mJobManager->CleanupJobs();

    expr  = ctx.mInterpreter.ParseExpression(std::string("opdataset set active --import ") + mepdsFileName);
    value = ctx.mInterpreter.Eval(expr);
    EXPECT_TRUE(value.HasNoError());

    unlink(mepdsFileName.c_str());
}